

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O2

int arith_decode(j_decompress_ptr cinfo,uchar *st)

{
  byte bVar1;
  int iVar2;
  jpeg_entropy_decoder *pjVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var7;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var8;
  long lVar9;
  
  pjVar3 = cinfo->entropy;
  p_Var7 = pjVar3[1].decode_mcu;
  while ((long)p_Var7 < 0x8000) {
    iVar2 = pjVar3[1].insufficient_data;
    iVar6 = iVar2 + -1;
    pjVar3[1].insufficient_data = iVar6;
    if (iVar2 < 1) {
      if (cinfo->unread_marker == 0) {
        uVar5 = get_byte(cinfo);
        if (uVar5 == 0xff) {
          do {
            uVar5 = get_byte(cinfo);
          } while ((char)uVar5 == -1);
          if ((uVar5 & 0xff) == 0) {
            uVar5 = 0xff;
          }
          else {
            cinfo->unread_marker = uVar5;
            uVar5 = 0;
          }
        }
        iVar6 = pjVar3[1].insufficient_data;
      }
      else {
        uVar5 = 0;
      }
      pjVar3[1].start_pass =
           (_func_void_j_decompress_ptr *)((long)pjVar3[1].start_pass << 8 | (ulong)uVar5);
      pjVar3[1].insufficient_data = iVar6 + 8;
      if ((iVar6 < -8) && (pjVar3[1].insufficient_data = iVar6 + 9, iVar6 + 9 == 0)) {
        pjVar3[1].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x8000;
      }
    }
    p_Var7 = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)((long)pjVar3[1].decode_mcu * 2);
    pjVar3[1].decode_mcu = p_Var7;
  }
  bVar1 = *st;
  uVar5 = (uint)bVar1;
  lVar4 = jpeg_aritab[bVar1 & 0x7f];
  p_Var8 = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)(lVar4 >> 0x10);
  p_Var7 = p_Var7 + -(long)p_Var8;
  pjVar3[1].decode_mcu = p_Var7;
  lVar9 = (long)p_Var7 << ((byte)pjVar3[1].insufficient_data & 0x3f);
  if ((long)pjVar3[1].start_pass < lVar9) {
    if (0x7fff < (long)p_Var7) goto LAB_00115676;
    if ((long)p_Var7 < (long)p_Var8) goto LAB_0011566b;
  }
  else {
    pjVar3[1].start_pass = pjVar3[1].start_pass + -lVar9;
    pjVar3[1].decode_mcu = p_Var8;
    if ((long)p_Var8 <= (long)p_Var7) {
LAB_0011566b:
      *st = bVar1 & 0x80 ^ (byte)lVar4;
      uVar5 = bVar1 ^ 0x80;
      goto LAB_00115676;
    }
  }
  *st = bVar1 & 0x80 ^ (byte)((ulong)lVar4 >> 8);
LAB_00115676:
  return uVar5 >> 7;
}

Assistant:

LOCAL(int)
arith_decode(j_decompress_ptr cinfo, unsigned char *st)
{
  register arith_entropy_ptr e = (arith_entropy_ptr)cinfo->entropy;
  register unsigned char nl, nm;
  register JLONG qe, temp;
  register int sv, data;

  /* Renormalization & data input per section D.2.6 */
  while (e->a < 0x8000L) {
    if (--e->ct < 0) {
      /* Need to fetch next data byte */
      if (cinfo->unread_marker)
        data = 0;               /* stuff zero data */
      else {
        data = get_byte(cinfo); /* read next input byte */
        if (data == 0xFF) {     /* zero stuff or marker code */
          do data = get_byte(cinfo);
          while (data == 0xFF); /* swallow extra 0xFF bytes */
          if (data == 0)
            data = 0xFF;        /* discard stuffed zero byte */
          else {
            /* Note: Different from the Huffman decoder, hitting
             * a marker while processing the compressed data
             * segment is legal in arithmetic coding.
             * The convention is to supply zero data
             * then until decoding is complete.
             */
            cinfo->unread_marker = data;
            data = 0;
          }
        }
      }
      e->c = (e->c << 8) | data; /* insert data into C register */
      if ((e->ct += 8) < 0)      /* update bit shift counter */
        /* Need more initial bytes */
        if (++e->ct == 0)
          /* Got 2 initial bytes -> re-init A and exit loop */
          e->a = 0x8000L; /* => e->a = 0x10000L after loop exit */
    }
    e->a <<= 1;
  }

  /* Fetch values from our compact representation of Table D.2:
   * Qe values and probability estimation state machine
   */
  sv = *st;
  qe = jpeg_aritab[sv & 0x7F];  /* => Qe_Value */
  nl = qe & 0xFF;  qe >>= 8;    /* Next_Index_LPS + Switch_MPS */
  nm = qe & 0xFF;  qe >>= 8;    /* Next_Index_MPS */

  /* Decode & estimation procedures per sections D.2.4 & D.2.5 */
  temp = e->a - qe;
  e->a = temp;
  temp <<= e->ct;
  if (e->c >= temp) {
    e->c -= temp;
    /* Conditional LPS (less probable symbol) exchange */
    if (e->a < qe) {
      e->a = qe;
      *st = (sv & 0x80) ^ nm;   /* Estimate_after_MPS */
    } else {
      e->a = qe;
      *st = (sv & 0x80) ^ nl;   /* Estimate_after_LPS */
      sv ^= 0x80;               /* Exchange LPS/MPS */
    }
  } else if (e->a < 0x8000L) {
    /* Conditional MPS (more probable symbol) exchange */
    if (e->a < qe) {
      *st = (sv & 0x80) ^ nl;   /* Estimate_after_LPS */
      sv ^= 0x80;               /* Exchange LPS/MPS */
    } else {
      *st = (sv & 0x80) ^ nm;   /* Estimate_after_MPS */
    }
  }

  return sv >> 7;
}